

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int do_oprom_code(int argc,char **argv)

{
  char *arg;
  _Bool _Var1;
  long in_FS_OFFSET;
  char *sub_command;
  char **local_20;
  char **argv_local;
  long lStack_10;
  int argc_local;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = argv;
  argv_local._4_4_ = argc;
  if (argc < 1) {
    if (!quiet) {
      fprintf(_stderr,"Error: Missing arguments\n");
    }
    sub_command._4_4_ = -1;
  }
  else {
    arg = *argv;
    arg_next((int *)((long)&argv_local + 4),&local_20);
    _Var1 = arg_is_token(arg,"version");
    if (_Var1) {
      sub_command._4_4_ = do_oprom_version(argv_local._4_4_,local_20,IGSC_OPROM_CODE);
    }
    else {
      _Var1 = arg_is_token(arg,"update");
      if (_Var1) {
        sub_command._4_4_ = do_oprom_update(argv_local._4_4_,local_20,IGSC_OPROM_CODE);
      }
      else {
        _Var1 = arg_is_token(arg,"supported-devices");
        if (_Var1) {
          sub_command._4_4_ = do_oprom_code_supported_devices(argv_local._4_4_,local_20);
        }
        else {
          if ((quiet & 1U) == 0) {
            fprintf(_stderr,"Error: Wrong argument %s\n",arg);
          }
          sub_command._4_4_ = -1;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_10) {
    return sub_command._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int do_oprom_code(int argc, char *argv[])
{
    const char *sub_command = NULL;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    sub_command = argv[0];

    arg_next(&argc, &argv);

    if (arg_is_token(sub_command, "version"))
    {
        return do_oprom_version(argc, argv, IGSC_OPROM_CODE);
    }

    if (arg_is_token(sub_command, "update"))
    {
        return do_oprom_update(argc, argv, IGSC_OPROM_CODE);
    }

    if (arg_is_token(sub_command, "supported-devices"))
    {
        return do_oprom_code_supported_devices(argc, argv);
    }

    fwupd_error("Wrong argument %s\n", sub_command);
    return ERROR_BAD_ARGUMENT;
}